

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O3

void __thiscall CppUnit::TestResultCollector::reset(TestResultCollector *this)

{
  SynchronizationObject *pSVar1;
  
  TestSuccessListener::reset(&this->super_TestSuccessListener);
  pSVar1 = (this->super_TestSuccessListener).super_SynchronizedObject.m_syncObject;
  (*pSVar1->_vptr_SynchronizationObject[2])(pSVar1);
  freeFailures(this);
  this->m_testErrors = 0;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::clear(&this->m_tests);
  (*pSVar1->_vptr_SynchronizationObject[3])(pSVar1);
  return;
}

Assistant:

void 
TestResultCollector::reset()
{
  TestSuccessListener::reset();

  ExclusiveZone zone( m_syncObject ); 
  freeFailures();
  m_testErrors = 0;
  m_tests.clear();
}